

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object.h
# Opt level: O3

void xemmai::t_finalizes<xemmai::t_bears<xemmai::t_module,_xemmai::t_type_of<xemmai::t_object>_>_>::
     f_do_finalize(t_object *a_this,t_scan a_scan)

{
  long in_FS_OFFSET;
  
  if (*(t_object **)(*(long *)(in_FS_OFFSET + -0x60) + 0x498) != a_this) {
    (*a_scan)(*(t_object **)(*(long *)a_this->v_data + 0x40));
    (*a_scan)(*(t_object **)(a_this->v_data + 8));
  }
  t_module::~t_module((t_module *)a_this->v_data);
  return;
}

Assistant:

void t_finalizes<T_base>::f_do_finalize(t_object* a_this, t_scan a_scan)
{
	using t = typename T_base::t_what;
	t_type_of<t>::f_do_scan(a_this, a_scan);
	a_this->f_as<t>().~t();
}